

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeSorterTreeDepth(int nPMA)

{
  i64 nDiv;
  int nDepth;
  int nPMA_local;
  
  nDepth = 0;
  for (nDiv = 0x10; nDiv < nPMA; nDiv = nDiv << 4) {
    nDepth = nDepth + 1;
  }
  return nDepth;
}

Assistant:

static int vdbeSorterTreeDepth(int nPMA){
  int nDepth = 0;
  i64 nDiv = SORTER_MAX_MERGE_COUNT;
  while( nDiv < (i64)nPMA ){
    nDiv = nDiv * SORTER_MAX_MERGE_COUNT;
    nDepth++;
  }
  return nDepth;
}